

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::anon_unknown_26::printHeaderString(ostream *os,string *_string,size_t indent)

{
  string *os_00;
  Column *pCVar1;
  ostream *poVar2;
  Column local_60;
  long local_28;
  size_t i;
  size_t indent_local;
  string *_string_local;
  ostream *os_local;
  
  i = indent;
  indent_local = (size_t)_string;
  _string_local = (string *)os;
  local_28 = std::__cxx11::string::find((char *)_string,0x4163b1);
  os_00 = _string_local;
  if (local_28 == -1) {
    local_28 = 0;
  }
  else {
    local_28 = local_28 + 2;
  }
  TextFlow::Column::Column(&local_60,(string *)indent_local);
  pCVar1 = TextFlow::Column::indent(&local_60,i + local_28);
  pCVar1 = TextFlow::Column::initialIndent(pCVar1,i);
  poVar2 = TextFlow::operator<<((ostream *)os_00,pCVar1);
  std::operator<<(poVar2,'\n');
  TextFlow::Column::~Column(&local_60);
  return;
}

Assistant:

void printHeaderString(std::ostream& os, std::string const& _string, std::size_t indent = 0) {
            std::size_t i = _string.find(": ");
            if (i != std::string::npos)
                i += 2;
            else
                i = 0;
            os << TextFlow::Column(_string)
                  .indent(indent + i)
                  .initialIndent(indent) << '\n';
        }